

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  bool bVar1;
  long in_RCX;
  long in_RDX;
  undefined4 in_ESI;
  atomic<bool> *in_RDI;
  MutexLock l;
  ManualCompaction manual;
  InternalKey end_storage;
  InternalKey begin_storage;
  Mutex *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  memory_order in_stack_ffffffffffffff14;
  CondVar *in_stack_ffffffffffffff20;
  ValueType in_stack_ffffffffffffff2c;
  SequenceNumber in_stack_ffffffffffffff30;
  Slice *in_stack_ffffffffffffff38;
  InternalKey *in_stack_ffffffffffffff40;
  undefined4 local_98;
  byte local_94;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  long local_20;
  long local_18;
  undefined4 local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  InternalKey::InternalKey((InternalKey *)0x1109e0);
  InternalKey::InternalKey((InternalKey *)0x1109ed);
  ManualCompaction::ManualCompaction((ManualCompaction *)0x1109f7);
  local_98 = local_c;
  local_94 = 0;
  if (local_18 == 0) {
    local_90 = (undefined1 *)0x0;
  }
  else {
    InternalKey::InternalKey
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c);
    InternalKey::operator=
              ((InternalKey *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (InternalKey *)in_stack_ffffffffffffff08);
    InternalKey::~InternalKey((InternalKey *)0x110a5a);
    local_90 = local_40;
  }
  if (local_20 == 0) {
    local_88 = (undefined1 *)0x0;
  }
  else {
    InternalKey::InternalKey
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c);
    InternalKey::operator=
              ((InternalKey *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (InternalKey *)in_stack_ffffffffffffff08);
    InternalKey::~InternalKey((InternalKey *)0x110ab1);
    local_88 = local_60;
  }
  MutexLock::MutexLock
            ((MutexLock *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  while( true ) {
    in_stack_ffffffffffffff14 = in_stack_ffffffffffffff14 & 0xffffff;
    if ((local_94 & 1) == 0) {
      bVar1 = std::atomic<bool>::load(in_RDI,in_stack_ffffffffffffff14);
      in_stack_ffffffffffffff14 = in_stack_ffffffffffffff14 & 0xffffff;
      if (!bVar1) {
        bVar1 = Status::ok((Status *)(in_RDI + 0xa28));
        in_stack_ffffffffffffff14 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff14);
      }
    }
    if ((char)(in_stack_ffffffffffffff14 >> 0x18) == '\0') break;
    if (*(long *)(in_RDI + 0xa18) == 0) {
      *(undefined4 **)(in_RDI + 0xa18) = &local_98;
      MaybeScheduleCompaction
                ((DBImpl *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    }
    else {
      port::CondVar::Wait(in_stack_ffffffffffffff20);
    }
  }
  if (*(undefined4 **)(in_RDI + 0xa18) == &local_98) {
    *(undefined8 *)(in_RDI + 0xa18) = 0;
  }
  MutexLock::~MutexLock((MutexLock *)0x110b8d);
  ManualCompaction::~ManualCompaction((ManualCompaction *)0x110b97);
  InternalKey::~InternalKey((InternalKey *)0x110ba4);
  InternalKey::~InternalKey((InternalKey *)0x110bb1);
  return;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice* begin,
                               const Slice* end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin == nullptr) {
    manual.begin = nullptr;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end == nullptr) {
    manual.end = nullptr;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.load(std::memory_order_acquire) &&
         bg_error_.ok()) {
    if (manual_compaction_ == nullptr) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      background_work_finished_signal_.Wait();
    }
  }
  if (manual_compaction_ == &manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = nullptr;
  }
}